

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int blobReadWrite(sqlite3_blob *pBlob,void *z,int n,int iOffset,
                 _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall)

{
  sqlite3 *db;
  Vdbe *p_00;
  int iVar1;
  Incrblob *p;
  
  if (pBlob != (sqlite3_blob *)0x0) {
    db = *(sqlite3 **)(pBlob + 0x20);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    iVar1 = 1;
    if ((-1 < (iOffset | n)) &&
       ((long)((ulong)(uint)n + (ulong)(uint)iOffset) <= (long)*(int *)pBlob)) {
      p_00 = *(Vdbe **)(pBlob + 0x18);
      iVar1 = 4;
      if (p_00 != (Vdbe *)0x0) {
        sqlite3BtreeEnter((Btree *)**(undefined8 **)(pBlob + 0x10));
        iVar1 = (*xCall)(*(BtCursor **)(pBlob + 0x10),iOffset + *(int *)(pBlob + 4),n,z);
        sqlite3BtreeLeave((Btree *)**(undefined8 **)(pBlob + 0x10));
        if (iVar1 == 4) {
          sqlite3VdbeFinalize(p_00);
          *(undefined8 *)(pBlob + 0x18) = 0;
          iVar1 = 4;
        }
        else {
          p_00->rc = iVar1;
        }
      }
    }
    sqlite3Error(db,iVar1);
    iVar1 = sqlite3ApiExit(db,iVar1);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar1;
  }
  iVar1 = sqlite3MisuseError(0x15241);
  return iVar1;
}

Assistant:

static int blobReadWrite(
  sqlite3_blob *pBlob, 
  void *z, 
  int n, 
  int iOffset, 
  int (*xCall)(BtCursor*, u32, u32, void*)
){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  Vdbe *v;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);
  v = (Vdbe*)p->pStmt;

  if( n<0 || iOffset<0 || ((sqlite3_int64)iOffset+n)>p->nByte ){
    /* Request is out of range. Return a transient error. */
    rc = SQLITE_ERROR;
  }else if( v==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    /* Call either BtreeData() or BtreePutData(). If SQLITE_ABORT is
    ** returned, clean-up the statement handle.
    */
    assert( db == v->db );
    sqlite3BtreeEnterCursor(p->pCsr);

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( xCall==sqlite3BtreePutData && db->xPreUpdateCallback ){
      /* If a pre-update hook is registered and this is a write cursor, 
      ** invoke it here. 
      ** 
      ** TODO: The preupdate-hook is passed SQLITE_DELETE, even though this
      ** operation should really be an SQLITE_UPDATE. This is probably
      ** incorrect, but is convenient because at this point the new.* values 
      ** are not easily obtainable. And for the sessions module, an 
      ** SQLITE_UPDATE where the PK columns do not change is handled in the 
      ** same way as an SQLITE_DELETE (the SQLITE_DELETE code is actually
      ** slightly more efficient). Since you cannot write to a PK column
      ** using the incremental-blob API, this works. For the sessions module
      ** anyhow.
      */
      sqlite3_int64 iKey;
      iKey = sqlite3BtreeIntegerKey(p->pCsr);
      sqlite3VdbePreUpdateHook(
          v, v->apCsr[0], SQLITE_DELETE, p->zDb, p->pTab, iKey, -1
      );
    }
#endif

    rc = xCall(p->pCsr, iOffset+p->iOffset, n, z);
    sqlite3BtreeLeaveCursor(p->pCsr);
    if( rc==SQLITE_ABORT ){
      sqlite3VdbeFinalize(v);
      p->pStmt = 0;
    }else{
      v->rc = rc;
    }
  }
  sqlite3Error(db, rc);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}